

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system.tab.cc
# Opt level: O1

void __thiscall
tchecker::parsing::system::parser_t::yypush_(parser_t *this,char *m,state_type s,symbol_type *sym)

{
  basic_symbol<tchecker::parsing::system::parser_t::by_state> bStack_98;
  
  stack_symbol_type::stack_symbol_type((stack_symbol_type *)&bStack_98,s,sym);
  yypush_(this,m,(stack_symbol_type *)&bStack_98);
  basic_symbol<tchecker::parsing::system::parser_t::by_state>::~basic_symbol(&bStack_98);
  return;
}

Assistant:

void
  parser_t::yypush_ (const char* m, state_type s, YY_MOVE_REF (symbol_type) sym)
  {
#if 201103L <= YY_CPLUSPLUS
    yypush_ (m, stack_symbol_type (s, std::move (sym)));
#else
    stack_symbol_type ss (s, sym);
    yypush_ (m, ss);
#endif
  }